

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O3

void __thiscall
CcsTest_Interpolation_Test::~CcsTest_Interpolation_Test(CcsTest_Interpolation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, Interpolation) {
  CcsDomain ccs;
  setenv("VAR1", "bar", true);
  std::istringstream input("a = 'foo${VAR1} baz'; b = 'foo\\${VAR1} baz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("foobar baz", ctx.getString("a"));
  EXPECT_EQ("foo${VAR1} baz", ctx.getString("b"));
  setenv("VAR1", "quux", true);
  EXPECT_EQ("foobar baz", ctx.getString("a"));
  unsetenv("VAR1");
}